

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O0

void __thiscall
f8n::runtime::MessageQueue::UnregisterForBroadcasts(MessageQueue *this,IMessageTarget *target)

{
  bool bVar1;
  reference pwVar2;
  element_type *peVar3;
  undefined1 local_60 [8];
  shared_ptr<f8n::runtime::IMessageTarget> shared;
  weak_ptr<f8n::runtime::IMessageTarget> it;
  iterator __end1;
  iterator __begin1;
  set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
  *__range1;
  LockT lock;
  IMessageTarget *target_local;
  MessageQueue *this_local;
  
  lock._8_8_ = target;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&__range1,&this->queueMutex);
  __end1 = std::
           set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
           ::begin(&this->receivers);
  it.super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
       ::end(&this->receivers);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&it.
                                                  super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount), bVar1) {
    pwVar2 = std::_Rb_tree_const_iterator<std::weak_ptr<f8n::runtime::IMessageTarget>_>::operator*
                       (&__end1);
    std::weak_ptr<f8n::runtime::IMessageTarget>::weak_ptr
              ((weak_ptr<f8n::runtime::IMessageTarget> *)
               &shared.super___shared_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,pwVar2);
    std::weak_ptr<f8n::runtime::IMessageTarget>::lock
              ((weak_ptr<f8n::runtime::IMessageTarget> *)local_60);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_60);
    if ((bVar1) &&
       (peVar3 = std::__shared_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>::get
                           ((__shared_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>
                             *)local_60), peVar3 == (element_type *)lock._8_8_)) {
      std::
      set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
      ::erase(&this->receivers,
              (key_type *)
              &shared.super___shared_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    std::shared_ptr<f8n::runtime::IMessageTarget>::~shared_ptr
              ((shared_ptr<f8n::runtime::IMessageTarget> *)local_60);
    if (!bVar1) {
      bVar1 = false;
    }
    std::weak_ptr<f8n::runtime::IMessageTarget>::~weak_ptr
              ((weak_ptr<f8n::runtime::IMessageTarget> *)
               &shared.super___shared_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (bVar1) break;
    std::_Rb_tree_const_iterator<std::weak_ptr<f8n::runtime::IMessageTarget>_>::operator++(&__end1);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&__range1);
  return;
}

Assistant:

void MessageQueue::UnregisterForBroadcasts(IMessageTarget *target) {
    LockT lock(this->queueMutex);
    for (auto it : this->receivers) {
        auto shared = it.lock();
        if (shared && shared.get() == target) {
            this->receivers.erase(it);
            return;
        }
    }
}